

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::BuildFileCollectingErrors
          (DescriptorPool *this,FileDescriptorProto *proto,ErrorCollector *error_collector)

{
  Tables *pTVar1;
  LogMessage *pLVar2;
  FileDescriptor *pFVar3;
  LogMessage LStack_1a8;
  LogMessage local_170;
  DescriptorBuilder local_138;
  
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    internal::LogMessage::LogMessage
              (&local_170,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0xd4a);
    pLVar2 = internal::LogMessage::operator<<
                       (&local_170,"CHECK failed: fallback_database_ == NULL: ");
    pLVar2 = internal::LogMessage::operator<<
                       (pLVar2,
                        "Cannot call BuildFile on a DescriptorPool that uses a DescriptorDatabase.  You must instead find a way to get your file into the underlying database."
                       );
    internal::LogFinisher::operator=((LogFinisher *)&local_138,pLVar2);
    internal::LogMessage::~LogMessage(&local_170);
  }
  if (this->mutex_ != (Mutex *)0x0) {
    internal::LogMessage::LogMessage
              (&LStack_1a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0xd4e);
    pLVar2 = internal::LogMessage::operator<<(&LStack_1a8,"CHECK failed: mutex_ == NULL: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_138,pLVar2);
    internal::LogMessage::~LogMessage(&LStack_1a8);
  }
  pTVar1 = (this->tables_).ptr_;
  if (pTVar1 != (Tables *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
             *)&pTVar1->known_bad_symbols_);
    pTVar1 = (this->tables_).ptr_;
    if (pTVar1 != (Tables *)0x0) {
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)&pTVar1->known_bad_files_);
      DescriptorBuilder::DescriptorBuilder(&local_138,this,(this->tables_).ptr_,error_collector);
      pFVar3 = DescriptorBuilder::BuildFile(&local_138,proto);
      DescriptorBuilder::~DescriptorBuilder(&local_138);
      return pFVar3;
    }
  }
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                ,0x5f,
                "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
               );
}

Assistant:

const FileDescriptor* DescriptorPool::BuildFileCollectingErrors(
    const FileDescriptorProto& proto,
    ErrorCollector* error_collector) {
  GOOGLE_CHECK(fallback_database_ == NULL)
    << "Cannot call BuildFile on a DescriptorPool that uses a "
       "DescriptorDatabase.  You must instead find a way to get your file "
       "into the underlying database.";
  GOOGLE_CHECK(mutex_ == NULL);   // Implied by the above GOOGLE_CHECK.
  tables_->known_bad_symbols_.clear();
  tables_->known_bad_files_.clear();
  return DescriptorBuilder(this, tables_.get(),
                           error_collector).BuildFile(proto);
}